

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O2

void __thiscall SSD1306::OledBitmap<16,_16>::xorPixel(OledBitmap<16,_16> *this,OledPoint p)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  bVar3 = OledPixel::pixelInside(&this->super_OledPixel,p);
  if (bVar3) {
    lVar2 = (long)((ulong)(uint)(p.m_x >> 0x1f) << 0x20 | (ulong)p & 0xffffffff) / 8;
    iVar4 = (int)lVar2;
    bVar5 = 7 - ((char)p.m_x + (char)lVar2 * -8);
    bVar1 = (this->blocks_)._M_elems[(long)p >> 0x20]._M_elems[iVar4];
    bVar7 = (byte)(1 << (bVar5 & 0x1f));
    bVar6 = ~bVar7 & bVar1;
    if ((bVar1 >> (bVar5 & 0x1f) & 1) == 0) {
      bVar6 = bVar7 | bVar1;
    }
    (this->blocks_)._M_elems[(long)p >> 0x20]._M_elems[iVar4] = bVar6;
  }
  return;
}

Assistant:

void
    xorPixel(
        SSD1306::OledPoint p) override
    {

        if (not pixelInside(p))
        {
            return;
        }

        PixelOffset offset{p};

        if (blocks_[offset.block][offset.byte] & (1 << offset.bit))
        {
            blocks_[offset.block][offset.byte] &= ~(1 << offset.bit);
        }
        else
        {
            blocks_[offset.block][offset.byte] |= (1 << offset.bit);
        }
    }